

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

int mpi_miller_rabin(mbedtls_mpi *X,size_t rounds,_func_int_void_ptr_uchar_ptr_size_t *f_rng,
                    void *p_rng)

{
  int iVar1;
  size_t count_00;
  size_t sVar2;
  size_t sVar3;
  bool bVar4;
  undefined1 local_c8 [8];
  mbedtls_mpi RR;
  mbedtls_mpi A;
  mbedtls_mpi T;
  mbedtls_mpi R;
  mbedtls_mpi W;
  size_t s;
  size_t k;
  size_t j;
  size_t i;
  int count;
  int ret;
  void *p_rng_local;
  _func_int_void_ptr_uchar_ptr_size_t *f_rng_local;
  size_t rounds_local;
  mbedtls_mpi *X_local;
  
  mbedtls_mpi_init((mbedtls_mpi *)&R.p);
  mbedtls_mpi_init((mbedtls_mpi *)&T.p);
  mbedtls_mpi_init((mbedtls_mpi *)&A.p);
  mbedtls_mpi_init((mbedtls_mpi *)&RR.p);
  mbedtls_mpi_init((mbedtls_mpi *)local_c8);
  i._4_4_ = mbedtls_mpi_sub_int((mbedtls_mpi *)&R.p,X,1);
  if (i._4_4_ == 0) {
    count_00 = mbedtls_mpi_lsb((mbedtls_mpi *)&R.p);
    i._4_4_ = mbedtls_mpi_copy((mbedtls_mpi *)&T.p,(mbedtls_mpi *)&R.p);
    if ((i._4_4_ == 0) &&
       (i._4_4_ = mbedtls_mpi_shift_r((mbedtls_mpi *)&T.p,count_00), i._4_4_ == 0)) {
      for (j = 0; j < rounds; j = j + 1) {
        i._0_4_ = 0;
        do {
          i._4_4_ = mbedtls_mpi_fill_random((mbedtls_mpi *)&RR.p,X->n << 3,f_rng,p_rng);
          if (i._4_4_ != 0) goto LAB_0011aedb;
          sVar2 = mbedtls_mpi_bitlen((mbedtls_mpi *)&RR.p);
          sVar3 = mbedtls_mpi_bitlen((mbedtls_mpi *)&R.p);
          if (sVar3 < sVar2) {
            *(ulong *)(A.n + (A._0_8_ + -1) * 8) =
                 (1L << ((char)sVar3 - 1U & 0x3f)) - 1U & *(ulong *)(A.n + (A._0_8_ + -1) * 8);
          }
          if (0x1e < (int)i) {
            i._4_4_ = -0xe;
            goto LAB_0011aedb;
          }
          iVar1 = mbedtls_mpi_cmp_mpi((mbedtls_mpi *)&RR.p,(mbedtls_mpi *)&R.p);
          bVar4 = true;
          if (iVar1 < 0) {
            iVar1 = mbedtls_mpi_cmp_int((mbedtls_mpi *)&RR.p,1);
            bVar4 = iVar1 < 1;
          }
          i._0_4_ = (int)i + 1;
        } while (bVar4);
        i._4_4_ = mbedtls_mpi_exp_mod((mbedtls_mpi *)&RR.p,(mbedtls_mpi *)&RR.p,(mbedtls_mpi *)&T.p,
                                      X,(mbedtls_mpi *)local_c8);
        if (i._4_4_ != 0) break;
        iVar1 = mbedtls_mpi_cmp_mpi((mbedtls_mpi *)&RR.p,(mbedtls_mpi *)&R.p);
        if ((iVar1 != 0) && (iVar1 = mbedtls_mpi_cmp_int((mbedtls_mpi *)&RR.p,1), iVar1 != 0)) {
          k = 1;
          while( true ) {
            bVar4 = false;
            if (k < count_00) {
              iVar1 = mbedtls_mpi_cmp_mpi((mbedtls_mpi *)&RR.p,(mbedtls_mpi *)&R.p);
              bVar4 = iVar1 != 0;
            }
            if (!bVar4) break;
            i._4_4_ = mbedtls_mpi_mul_mpi((mbedtls_mpi *)&A.p,(mbedtls_mpi *)&RR.p,
                                          (mbedtls_mpi *)&RR.p);
            if ((i._4_4_ != 0) ||
               (i._4_4_ = mbedtls_mpi_mod_mpi((mbedtls_mpi *)&RR.p,(mbedtls_mpi *)&A.p,X),
               i._4_4_ != 0)) goto LAB_0011aedb;
            iVar1 = mbedtls_mpi_cmp_int((mbedtls_mpi *)&RR.p,1);
            if (iVar1 == 0) break;
            k = k + 1;
          }
          iVar1 = mbedtls_mpi_cmp_mpi((mbedtls_mpi *)&RR.p,(mbedtls_mpi *)&R.p);
          if ((iVar1 != 0) || (iVar1 = mbedtls_mpi_cmp_int((mbedtls_mpi *)&RR.p,1), iVar1 == 0)) {
            i._4_4_ = -0xe;
            break;
          }
        }
      }
    }
  }
LAB_0011aedb:
  mbedtls_mpi_free((mbedtls_mpi *)&R.p);
  mbedtls_mpi_free((mbedtls_mpi *)&T.p);
  mbedtls_mpi_free((mbedtls_mpi *)&A.p);
  mbedtls_mpi_free((mbedtls_mpi *)&RR.p);
  mbedtls_mpi_free((mbedtls_mpi *)local_c8);
  return i._4_4_;
}

Assistant:

static int mpi_miller_rabin( const mbedtls_mpi *X, size_t rounds,
                             int (*f_rng)(void *, unsigned char *, size_t),
                             void *p_rng )
{
    int ret, count;
    size_t i, j, k, s;
    mbedtls_mpi W, R, T, A, RR;

    MPI_VALIDATE_RET( X     != NULL );
    MPI_VALIDATE_RET( f_rng != NULL );

    mbedtls_mpi_init( &W ); mbedtls_mpi_init( &R );
    mbedtls_mpi_init( &T ); mbedtls_mpi_init( &A );
    mbedtls_mpi_init( &RR );

    /*
     * W = |X| - 1
     * R = W >> lsb( W )
     */
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_int( &W, X, 1 ) );
    s = mbedtls_mpi_lsb( &W );
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &R, &W ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &R, s ) );

    for( i = 0; i < rounds; i++ )
    {
        /*
         * pick a random A, 1 < A < |X| - 1
         */
        count = 0;
        do {
            MBEDTLS_MPI_CHK( mbedtls_mpi_fill_random( &A, X->n * ciL, f_rng, p_rng ) );

            j = mbedtls_mpi_bitlen( &A );
            k = mbedtls_mpi_bitlen( &W );
            if (j > k) {
                A.p[A.n - 1] &= ( (mbedtls_mpi_uint) 1 << ( k - ( A.n - 1 ) * biL - 1 ) ) - 1;
            }

            if (count++ > 30) {
                ret = MBEDTLS_ERR_MPI_NOT_ACCEPTABLE;
                goto cleanup;
            }

        } while ( mbedtls_mpi_cmp_mpi( &A, &W ) >= 0 ||
                  mbedtls_mpi_cmp_int( &A, 1 )  <= 0    );

        /*
         * A = A^R mod |X|
         */
        MBEDTLS_MPI_CHK( mbedtls_mpi_exp_mod( &A, &A, &R, X, &RR ) );

        if( mbedtls_mpi_cmp_mpi( &A, &W ) == 0 ||
            mbedtls_mpi_cmp_int( &A,  1 ) == 0 )
            continue;

        j = 1;
        while( j < s && mbedtls_mpi_cmp_mpi( &A, &W ) != 0 )
        {
            /*
             * A = A * A mod |X|
             */
            MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &T, &A, &A ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_mod_mpi( &A, &T, X  ) );

            if( mbedtls_mpi_cmp_int( &A, 1 ) == 0 )
                break;

            j++;
        }

        /*
         * not prime if A != |X| - 1 or A == 1
         */
        if( mbedtls_mpi_cmp_mpi( &A, &W ) != 0 ||
            mbedtls_mpi_cmp_int( &A,  1 ) == 0 )
        {
            ret = MBEDTLS_ERR_MPI_NOT_ACCEPTABLE;
            break;
        }
    }

cleanup:
    mbedtls_mpi_free( &W ); mbedtls_mpi_free( &R );
    mbedtls_mpi_free( &T ); mbedtls_mpi_free( &A );
    mbedtls_mpi_free( &RR );

    return( ret );
}